

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O0

DeepTiledOutputFile * __thiscall
Imf_2_5::MultiPartOutputFile::getOutputPart<Imf_2_5::DeepTiledOutputFile>
          (MultiPartOutputFile *this,int partNumber)

{
  bool bVar1;
  iterator __k;
  DeepTiledOutputFile *pDVar2;
  map<int,_Imf_2_5::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>_>
  *this_00;
  mapped_type *ppGVar3;
  int in_ESI;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_GenericOutputFile_*>_>::value,_pair<iterator,_bool>_>
  _Var4;
  DeepTiledOutputFile *file;
  Lock lock;
  OutputPartData *in_stack_00000118;
  DeepTiledOutputFile *in_stack_00000120;
  map<int,_Imf_2_5::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>_>
  *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  pair<int,_Imf_2_5::GenericOutputFile_*> *in_stack_ffffffffffffff48;
  Lock *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  _Self local_48 [3];
  _Self local_30 [3];
  int local_14;
  DeepTiledOutputFile *local_8;
  
  local_14 = in_ESI;
  IlmThread_2_5::Lock::Lock
            (in_stack_ffffffffffffff50,(Mutex *)in_stack_ffffffffffffff48,
             (bool)in_stack_ffffffffffffff47);
  __k = std::
        map<int,_Imf_2_5::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>_>
        ::find(in_stack_ffffffffffffff38,(key_type *)0x2c94d3);
  local_30[0]._M_node = __k._M_node;
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_Imf_2_5::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator==(local_30,local_48);
  if (bVar1) {
    pDVar2 = (DeepTiledOutputFile *)operator_new(0x10);
    std::vector<Imf_2_5::OutputPartData_*,_std::allocator<Imf_2_5::OutputPartData_*>_>::operator[]
              ((vector<Imf_2_5::OutputPartData_*,_std::allocator<Imf_2_5::OutputPartData_*>_> *)
               (*(long *)(in_RDI + 8) + 0x38),(long)local_14);
    DeepTiledOutputFile::DeepTiledOutputFile(in_stack_00000120,in_stack_00000118);
    this_00 = (map<int,_Imf_2_5::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>_>
               *)(*(long *)(in_RDI + 8) + 0x58);
    std::make_pair<int&,Imf_2_5::GenericOutputFile*>
              ((int *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (GenericOutputFile **)in_stack_ffffffffffffff38);
    _Var4 = std::
            map<int,Imf_2_5::GenericOutputFile*,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericOutputFile*>>>
            ::insert<std::pair<int,Imf_2_5::GenericOutputFile*>>(this_00,in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff47 = _Var4.second;
    local_8 = pDVar2;
  }
  else {
    ppGVar3 = std::
              map<int,_Imf_2_5::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>_>
              ::operator[]((map<int,_Imf_2_5::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (key_type *)__k._M_node);
    local_8 = (DeepTiledOutputFile *)*ppGVar3;
  }
  IlmThread_2_5::Lock::~Lock((Lock *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  return local_8;
}

Assistant:

T*
MultiPartOutputFile::getOutputPart(int partNumber)
{
    Lock lock(*_data);
    if (_data->_outputFiles.find(partNumber) == _data->_outputFiles.end())
    {
        T* file = new T(_data->parts[partNumber]);
        _data->_outputFiles.insert(std::make_pair(partNumber, (GenericOutputFile*) file));
        return file;
    }
    else return (T*) _data->_outputFiles[partNumber];
}